

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  long *plVar1;
  OfType OVar2;
  IStreamingReporter *pIVar3;
  int iVar4;
  long lVar5;
  AssertionStats local_180;
  string local_78;
  string local_58;
  allocator<char> local_32;
  allocator<char> local_31;
  
  OVar2 = (result->m_resultData).resultType;
  if (OVar2 == Ok) {
    lVar5 = 0x110;
  }
  else if (((OVar2 & FailureBit) == Ok) ||
          (lVar5 = 0x118, ((result->m_info).resultDisposition & SuppressFail) != 0))
  goto LAB_0015599c;
  plVar1 = (long *)((long)&(this->super_IResultCapture)._vptr_IResultCapture + lVar5);
  *plVar1 = *plVar1 + 1;
LAB_0015599c:
  pIVar3 = (this->m_reporter).m_p;
  AssertionStats::AssertionStats(&local_180,result,&this->m_messages,&this->m_totals);
  iVar4 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(pIVar3,&local_180);
  AssertionStats::~AssertionStats(&local_180);
  if ((char)iVar4 != '\0') {
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"{Unknown expression after the reported line}",&local_31);
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)&local_180,&local_78,&(this->m_lastAssertionInfo).lineInfo,&local_58,
             (this->m_lastAssertionInfo).resultDisposition);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,(AssertionInfo *)&local_180);
  AssertionInfo::~AssertionInfo((AssertionInfo *)&local_180);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  AssertionResult::operator=(&this->m_lastResult,result);
  return;
}

Assistant:

virtual void assertionEnded( AssertionResult const& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;
            }

            if( m_reporter->assertionEnded( AssertionStats( result, m_messages, m_totals ) ) )
                m_messages.clear();

            // Reset working state
            m_lastAssertionInfo = AssertionInfo( "", m_lastAssertionInfo.lineInfo, "{Unknown expression after the reported line}" , m_lastAssertionInfo.resultDisposition );
            m_lastResult = result;
        }